

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlRelaxNGDefinePtr_conflict *
xmlRelaxNGGetElements(xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict def,int eora)

{
  xmlRelaxNGDefinePtr pxVar1;
  xmlRelaxNGDefinePtr_conflict pxVar2;
  xmlRelaxNGDefinePtr_conflict *temp;
  int max;
  int len;
  xmlRelaxNGDefinePtr_conflict tmp;
  xmlRelaxNGDefinePtr_conflict cur;
  xmlRelaxNGDefinePtr_conflict parent;
  xmlRelaxNGDefinePtr_conflict *ret;
  int eora_local;
  xmlRelaxNGDefinePtr_conflict def_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  parent = (xmlRelaxNGDefinePtr_conflict)0x0;
  temp._4_4_ = 0;
  temp._0_4_ = 0;
  pxVar1 = def;
  if (ctxt->nbErrors == 0) {
LAB_001c9b30:
    tmp = pxVar1;
    if (tmp != (xmlRelaxNGDefinePtr_conflict)0x0) {
      if ((((eora == 0) && ((tmp->type == XML_RELAXNG_ELEMENT || (tmp->type == XML_RELAXNG_TEXT))))
          || ((eora == 1 && (tmp->type == XML_RELAXNG_ATTRIBUTE)))) ||
         ((eora == 2 &&
          ((((tmp->type == XML_RELAXNG_DATATYPE || (tmp->type == XML_RELAXNG_ELEMENT)) ||
            (tmp->type == XML_RELAXNG_LIST)) ||
           ((tmp->type == XML_RELAXNG_TEXT || (tmp->type == XML_RELAXNG_VALUE)))))))) {
        if (parent == (xmlRelaxNGDefinePtr_conflict)0x0) {
          temp._0_4_ = 10;
          pxVar2 = (xmlRelaxNGDefinePtr_conflict)(*xmlMalloc)(0x58);
          if (pxVar2 == (xmlRelaxNGDefinePtr_conflict)0x0) {
            xmlRngPErrMemory(ctxt);
            return (xmlRelaxNGDefinePtr_conflict *)0x0;
          }
        }
        else {
          pxVar2 = parent;
          if ((int)temp <= temp._4_4_) {
            temp._0_4_ = (int)temp * 2;
            pxVar2 = (xmlRelaxNGDefinePtr_conflict)(*xmlRealloc)(parent,(long)((int)temp + 1) << 3);
            if (pxVar2 == (xmlRelaxNGDefinePtr_conflict)0x0) {
              xmlRngPErrMemory(ctxt);
              (*xmlFree)(parent);
              return (xmlRelaxNGDefinePtr_conflict *)0x0;
            }
          }
        }
        parent = pxVar2;
        *(xmlRelaxNGDefinePtr_conflict *)(&parent->type + (long)temp._4_4_ * 2) = tmp;
        *(undefined8 *)(&parent->type + (long)(temp._4_4_ + 1) * 2) = 0;
        temp._4_4_ = temp._4_4_ + 1;
LAB_001c9d29:
        if (tmp == def) goto LAB_001c9da3;
        if (tmp->next == (xmlRelaxNGDefinePtr)0x0) {
          do {
            tmp = tmp->parent;
            pxVar1 = tmp;
            if (tmp == (xmlRelaxNGDefinePtr_conflict)0x0) break;
            if (tmp == def) {
              return (xmlRelaxNGDefinePtr_conflict *)parent;
            }
            if (tmp->next != (xmlRelaxNGDefinePtr)0x0) {
              pxVar1 = tmp->next;
              break;
            }
          } while (tmp != (xmlRelaxNGDefinePtr_conflict)0x0);
        }
        else {
          pxVar1 = tmp->next;
        }
      }
      else {
        if ((((((tmp->type != XML_RELAXNG_CHOICE) && (tmp->type != XML_RELAXNG_INTERLEAVE)) &&
              ((tmp->type != XML_RELAXNG_GROUP &&
               ((((tmp->type != XML_RELAXNG_ONEORMORE && (tmp->type != XML_RELAXNG_ZEROORMORE)) &&
                 (tmp->type != XML_RELAXNG_OPTIONAL)) &&
                ((tmp->type != XML_RELAXNG_PARENTREF && (tmp->type != XML_RELAXNG_REF)))))))) &&
             (tmp->type != XML_RELAXNG_DEF)) && (tmp->type != XML_RELAXNG_EXTERNALREF)) ||
           (tmp->content == (xmlRelaxNGDefinePtr)0x0)) goto LAB_001c9d29;
        pxVar1 = tmp->content;
        for (_max = pxVar1; _max != (xmlRelaxNGDefinePtr)0x0; _max = _max->next) {
          _max->parent = tmp;
        }
      }
      goto LAB_001c9b30;
    }
LAB_001c9da3:
    ctxt_local = (xmlRelaxNGParserCtxtPtr)parent;
  }
  else {
    ctxt_local = (xmlRelaxNGParserCtxtPtr)0x0;
  }
  return (xmlRelaxNGDefinePtr_conflict *)ctxt_local;
}

Assistant:

static xmlRelaxNGDefinePtr *
xmlRelaxNGGetElements(xmlRelaxNGParserCtxtPtr ctxt,
                      xmlRelaxNGDefinePtr def, int eora)
{
    xmlRelaxNGDefinePtr *ret = NULL, parent, cur, tmp;
    int len = 0;
    int max = 0;

    /*
     * Don't run that check in case of error. Infinite recursion
     * becomes possible.
     */
    if (ctxt->nbErrors != 0)
        return (NULL);

    parent = NULL;
    cur = def;
    while (cur != NULL) {
        if (((eora == 0) && ((cur->type == XML_RELAXNG_ELEMENT) ||
                             (cur->type == XML_RELAXNG_TEXT))) ||
            ((eora == 1) && (cur->type == XML_RELAXNG_ATTRIBUTE)) ||
            ((eora == 2) && ((cur->type == XML_RELAXNG_DATATYPE) ||
	                     (cur->type == XML_RELAXNG_ELEMENT) ||
			     (cur->type == XML_RELAXNG_LIST) ||
                             (cur->type == XML_RELAXNG_TEXT) ||
			     (cur->type == XML_RELAXNG_VALUE)))) {
            if (ret == NULL) {
                max = 10;
                ret = (xmlRelaxNGDefinePtr *)
                    xmlMalloc((max + 1) * sizeof(xmlRelaxNGDefinePtr));
                if (ret == NULL) {
                    xmlRngPErrMemory(ctxt);
                    return (NULL);
                }
            } else if (max <= len) {
	        xmlRelaxNGDefinePtr *temp;

                max *= 2;
                temp = xmlRealloc(ret,
                               (max + 1) * sizeof(xmlRelaxNGDefinePtr));
                if (temp == NULL) {
                    xmlRngPErrMemory(ctxt);
		    xmlFree(ret);
                    return (NULL);
                }
		ret = temp;
            }
            ret[len++] = cur;
            ret[len] = NULL;
        } else if ((cur->type == XML_RELAXNG_CHOICE) ||
                   (cur->type == XML_RELAXNG_INTERLEAVE) ||
                   (cur->type == XML_RELAXNG_GROUP) ||
                   (cur->type == XML_RELAXNG_ONEORMORE) ||
                   (cur->type == XML_RELAXNG_ZEROORMORE) ||
                   (cur->type == XML_RELAXNG_OPTIONAL) ||
                   (cur->type == XML_RELAXNG_PARENTREF) ||
                   (cur->type == XML_RELAXNG_REF) ||
                   (cur->type == XML_RELAXNG_DEF) ||
		   (cur->type == XML_RELAXNG_EXTERNALREF)) {
            /*
             * Don't go within elements or attributes or string values.
             * Just gather the element top list
             */
            if (cur->content != NULL) {
                parent = cur;
                cur = cur->content;
                tmp = cur;
                while (tmp != NULL) {
                    tmp->parent = parent;
                    tmp = tmp->next;
                }
                continue;
            }
        }
        if (cur == def)
            break;
        if (cur->next != NULL) {
            cur = cur->next;
            continue;
        }
        do {
            cur = cur->parent;
            if (cur == NULL)
                break;
            if (cur == def)
                return (ret);
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }
        } while (cur != NULL);
    }
    return (ret);
}